

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Multiply_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  JavascriptNumber *pJVar7;
  double dVar8;
  double dVar9;
  double product;
  TypeId typeRight;
  TypeId typeLeft;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId;
  TypeId typeId_1;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
    if (bVar2) {
      local_28 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_28 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_28) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aRight);
  if (bVar2) {
    local_34 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight);
    if (bVar2) {
      local_34 = TypeIds_Number;
    }
    else {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      if (pRVar5 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_34 = RecyclableObject::GetTypeId(pRVar5);
      if ((0x57 < (int)local_34) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if ((local_28 == TypeIds_BigInt) || (local_34 == TypeIds_BigInt)) {
    if (local_34 == local_28) {
      pvVar6 = JavascriptBigInt::Mul(aLeft,aRight);
      return pvVar6;
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Multiply BigInt");
  }
  bVar2 = JavascriptNumber::Is(aLeft);
  if (bVar2) {
    bVar2 = JavascriptNumber::Is(aRight);
    if (bVar2) {
      dVar9 = JavascriptNumber::GetValue(aLeft);
      dVar8 = JavascriptNumber::GetValue(aRight);
      pvVar6 = JavascriptNumber::ToVarInPlace(dVar9 * dVar8,scriptContext,result);
      return pvVar6;
    }
    bVar2 = TaggedInt::Is(aRight);
    if (bVar2) {
      dVar9 = JavascriptNumber::GetValue(aLeft);
      dVar8 = TaggedInt::ToDouble(aRight);
      pvVar6 = JavascriptNumber::ToVarInPlace(dVar9 * dVar8,scriptContext,result);
      return pvVar6;
    }
  }
  else {
    bVar2 = JavascriptNumber::Is(aRight);
    if (bVar2) {
      bVar2 = TaggedInt::Is(aLeft);
      if (bVar2) {
        dVar9 = TaggedInt::ToDouble(aLeft);
        dVar8 = JavascriptNumber::GetValue(aRight);
        pvVar6 = JavascriptNumber::ToVarInPlace(dVar9 * dVar8,scriptContext,result);
        return pvVar6;
      }
    }
    else {
      bVar2 = TaggedInt::IsPair(aLeft,aRight);
      if (bVar2) {
        pvVar6 = TaggedInt::MultiplyInPlace(aLeft,aRight,scriptContext,result);
        return pvVar6;
      }
    }
  }
  dVar9 = Multiply_Helper(aLeft,aRight,scriptContext);
  pJVar7 = JavascriptNumber::InPlaceNew(dVar9,scriptContext,result);
  return pJVar7;
}

Assistant:

Var JavascriptMath::Multiply_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MultiplyInPlace);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeft);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRight);
            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Multiply BigInt"));
                }
                return JavascriptBigInt::Mul(aLeft, aRight);
            }

            if(JavascriptNumber::Is(aLeft))
            {
                if(JavascriptNumber::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
                else if (TaggedInt::Is(aRight))
                {
                    return JavascriptNumber::ToVarInPlace(
                        JavascriptNumber::GetValue(aLeft) * TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is(aRight))
            {
                if(TaggedInt::Is(aLeft))
                {
                    return JavascriptNumber::ToVarInPlace(
                        TaggedInt::ToDouble(aLeft) * JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if(TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::MultiplyInPlace(aLeft, aRight, scriptContext, result);
            }
            double product = Multiply_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(product, scriptContext, result);
            JIT_HELPER_END(Op_MultiplyInPlace);
        }